

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O3

ai_real Assimp::ComputePositionEpsilon(aiMesh *pMesh)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  float fVar5;
  undefined8 uVar6;
  float fVar8;
  undefined8 uVar9;
  float fVar11;
  undefined1 auVar7 [16];
  undefined1 auVar10 [16];
  
  if ((ulong)pMesh->mNumVertices == 0) {
    fVar5 = -2e+10;
    uVar9 = 0x501502f9501502f9;
    uVar6 = 0xd01502f9d01502f9;
  }
  else {
    fVar11 = 1e+10;
    fVar5 = -1e+10;
    lVar4 = 0;
    auVar7 = _DAT_00701650;
    auVar10 = _DAT_00701660;
    do {
      fVar8 = *(float *)((long)&pMesh->mVertices->z + lVar4);
      if (fVar8 <= fVar11) {
        fVar11 = fVar8;
      }
      uVar1 = *(ulong *)((long)&pMesh->mVertices->x + lVar4);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar1;
      auVar10 = minps(auVar10,auVar2);
      uVar9 = auVar10._0_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar1;
      auVar7 = maxps(auVar7,auVar3);
      uVar6 = auVar7._0_8_;
      if (fVar5 <= fVar8) {
        fVar5 = fVar8;
      }
      lVar4 = lVar4 + 0xc;
    } while ((ulong)pMesh->mNumVertices * 0xc != lVar4);
    fVar5 = fVar5 - fVar11;
  }
  fVar11 = (float)uVar6 - (float)uVar9;
  fVar8 = (float)((ulong)uVar6 >> 0x20) - (float)((ulong)uVar9 >> 0x20);
  return SQRT(fVar5 * fVar5 + fVar11 * fVar11 + fVar8 * fVar8) * 0.0001;
}

Assistant:

ai_real ComputePositionEpsilon(const aiMesh* pMesh)
{
    const ai_real epsilon = ai_real( 1e-4 );

    // calculate the position bounds so we have a reliable epsilon to check position differences against
    aiVector3D minVec, maxVec;
    ArrayBounds(pMesh->mVertices,pMesh->mNumVertices,minVec,maxVec);
    return (maxVec - minVec).Length() * epsilon;
}